

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_prepare_texture_image
               (demo *demo,uint32_t *tex_colors,texture_object *tex_obj,VkImageTiling tiling,
               VkImageUsageFlags usage,VkFlags required_props)

{
  _Bool _Var1;
  VkResult VVar2;
  uint32_t *row;
  int32_t y;
  int32_t x;
  void *data;
  VkSubresourceLayout layout;
  VkImageSubresource subres;
  VkMemoryRequirements mem_reqs;
  VkMemoryAllocateInfo mem_alloc;
  VkImageCreateInfo image_create_info;
  _Bool pass;
  VkResult err;
  int32_t tex_height;
  int32_t tex_width;
  VkFormat tex_format;
  VkFlags required_props_local;
  VkImageUsageFlags usage_local;
  VkImageTiling tiling_local;
  texture_object *tex_obj_local;
  uint32_t *tex_colors_local;
  demo *demo_local;
  
  tex_obj->tex_width = 2;
  tex_obj->tex_height = 2;
  mem_alloc.memoryTypeIndex = 0xe;
  mem_reqs.memoryTypeBits = 5;
  mem_reqs._20_4_ = 0;
  mem_alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  mem_alloc._4_4_ = 0;
  mem_alloc.pNext = (void *)0x0;
  mem_alloc.allocationSize = 0;
  VVar2 = (*glad_vkCreateImage)
                    (demo->device,(VkImageCreateInfo *)&mem_alloc.memoryTypeIndex,
                     (VkAllocationCallbacks *)0x0,&tex_obj->image);
  if (VVar2 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3b2,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  (*glad_vkGetImageMemoryRequirements)
            (demo->device,tex_obj->image,(VkMemoryRequirements *)&subres.mipLevel);
  mem_alloc.pNext = (void *)subres._4_8_;
  _Var1 = memory_type_from_properties
                    (demo,(uint32_t)mem_reqs.alignment,required_props,
                     (uint32_t *)&mem_alloc.allocationSize);
  if (!_Var1) {
    __assert_fail("pass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3ba,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  VVar2 = (*glad_vkAllocateMemory)
                    (demo->device,(VkMemoryAllocateInfo *)&mem_reqs.memoryTypeBits,
                     (VkAllocationCallbacks *)0x0,&tex_obj->mem);
  if (VVar2 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x3be,
                  "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                 );
  }
  VVar2 = (*glad_vkBindImageMemory)(demo->device,tex_obj->image,tex_obj->mem,0);
  if (VVar2 == VK_SUCCESS) {
    if ((required_props & 2) != 0) {
      stack0xffffffffffffff24 = 1;
      subres.aspectMask = 0;
      (*glad_vkGetImageSubresourceLayout)
                (demo->device,tex_obj->image,(VkImageSubresource *)((long)&layout.depthPitch + 4),
                 (VkSubresourceLayout *)&data);
      VVar2 = (*glad_vkMapMemory)(demo->device,tex_obj->mem,0,(VkDeviceSize)mem_alloc.pNext,0,
                                  (void **)&y);
      if (VVar2 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                      ,0x3d3,
                      "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
                     );
      }
      for (row._0_4_ = 0; (int)(uint)row < 2; row._0_4_ = (uint)row + 1) {
        for (row._4_4_ = 0; (int)row._4_4_ < 2; row._4_4_ = row._4_4_ + 1) {
          *(uint32_t *)((long)_y + (long)(int)row._4_4_ * 4 + layout.size * (long)(int)(uint)row) =
               tex_colors[(int)(row._4_4_ & 1 ^ (uint)row & 1)];
        }
      }
      (*glad_vkUnmapMemory)(demo->device,tex_obj->mem);
    }
    tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    demo_set_image_layout
              (demo,tex_obj->image,1,VK_IMAGE_LAYOUT_PREINITIALIZED,tex_obj->imageLayout,
               VK_ACCESS_HOST_WRITE_BIT);
    return;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                ,0x3c2,
                "void demo_prepare_texture_image(struct demo *, const uint32_t *, struct texture_object *, VkImageTiling, VkImageUsageFlags, VkFlags)"
               );
}

Assistant:

static void
demo_prepare_texture_image(struct demo *demo, const uint32_t *tex_colors,
                           struct texture_object *tex_obj, VkImageTiling tiling,
                           VkImageUsageFlags usage, VkFlags required_props) {
    const VkFormat tex_format = VK_FORMAT_B8G8R8A8_UNORM;
    const int32_t tex_width = 2;
    const int32_t tex_height = 2;
    VkResult U_ASSERT_ONLY err;
    bool U_ASSERT_ONLY pass;

    tex_obj->tex_width = tex_width;
    tex_obj->tex_height = tex_height;

    const VkImageCreateInfo image_create_info = {
        .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
        .pNext = NULL,
        .imageType = VK_IMAGE_TYPE_2D,
        .format = tex_format,
        .extent = {tex_width, tex_height, 1},
        .mipLevels = 1,
        .arrayLayers = 1,
        .samples = VK_SAMPLE_COUNT_1_BIT,
        .tiling = tiling,
        .usage = usage,
        .flags = 0,
        .initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED
    };
    VkMemoryAllocateInfo mem_alloc = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0,
    };

    VkMemoryRequirements mem_reqs;

    err =
        vkCreateImage(demo->device, &image_create_info, NULL, &tex_obj->image);
    assert(!err);

    vkGetImageMemoryRequirements(demo->device, tex_obj->image, &mem_reqs);

    mem_alloc.allocationSize = mem_reqs.size;
    pass =
        memory_type_from_properties(demo, mem_reqs.memoryTypeBits,
                                    required_props, &mem_alloc.memoryTypeIndex);
    assert(pass);

    /* allocate memory */
    err = vkAllocateMemory(demo->device, &mem_alloc, NULL, &tex_obj->mem);
    assert(!err);

    /* bind memory */
    err = vkBindImageMemory(demo->device, tex_obj->image, tex_obj->mem, 0);
    assert(!err);

    if (required_props & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) {
        const VkImageSubresource subres = {
            .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
            .mipLevel = 0,
            .arrayLayer = 0,
        };
        VkSubresourceLayout layout;
        void *data;
        int32_t x, y;

        vkGetImageSubresourceLayout(demo->device, tex_obj->image, &subres,
                                    &layout);

        err = vkMapMemory(demo->device, tex_obj->mem, 0,
                          mem_alloc.allocationSize, 0, &data);
        assert(!err);

        for (y = 0; y < tex_height; y++) {
            uint32_t *row = (uint32_t *)((char *)data + layout.rowPitch * y);
            for (x = 0; x < tex_width; x++)
                row[x] = tex_colors[(x & 1) ^ (y & 1)];
        }

        vkUnmapMemory(demo->device, tex_obj->mem);
    }

    tex_obj->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    demo_set_image_layout(demo, tex_obj->image, VK_IMAGE_ASPECT_COLOR_BIT,
                          VK_IMAGE_LAYOUT_PREINITIALIZED, tex_obj->imageLayout,
                          VK_ACCESS_HOST_WRITE_BIT);
    /* setting the image layout does not reference the actual memory so no need
     * to add a mem ref */
}